

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::cbtArcSegmentCollisionAlgorithm::processCollision
          (cbtArcSegmentCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  float fVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  uint uVar9;
  float fVar10;
  cbtScalar cVar11;
  float fVar12;
  cbtScalar cVar13;
  float fVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  cbtPersistentManifold *this_00;
  cbtCollisionShape *pcVar22;
  cbtCollisionObject *pcVar23;
  cbtCollisionObject *pcVar24;
  cbtCollisionShape *pcVar25;
  float fVar26;
  undefined8 uVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  int iVar31;
  long lVar32;
  cbtManifoldPoint *pt;
  cbtCollisionObjectWrapper *pcVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar55 [56];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined4 uVar63;
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM25 [16];
  cbtVector3 cVar68;
  cbtVector3 normal_on_2;
  cbtVector3 pos2;
  undefined8 local_118;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  cbtVector3 local_a8;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  cbtVector3 local_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar52 [56];
  
  this_00 = this->m_manifoldPtr;
  if (this_00 == (cbtPersistentManifold *)0x0) {
    return;
  }
  bVar21 = this->m_isSwapped;
  resultOut->m_manifoldPtr = this_00;
  iVar31 = this_00->m_cachedPoints;
  pcVar33 = body1;
  if (bVar21 != false) {
    pcVar33 = body0;
    body0 = body1;
  }
  if (0 < iVar31) {
    pt = this_00->m_pointCache;
    lVar32 = 0;
    do {
      cbtPersistentManifold::clearUserCache(this_00,pt);
      iVar31 = this_00->m_cachedPoints;
      lVar32 = lVar32 + 1;
      pt = pt + 1;
    } while (lVar32 < iVar31);
  }
  if (iVar31 != 0 && gContactEndedCallback != (ContactEndedCallback)0x0) {
    local_a8.m_floats._0_8_ = this_00;
    (*gContactEndedCallback)((cbtPersistentManifold **)&local_a8);
  }
  this_00->m_cachedPoints = 0;
  pcVar22 = body0->m_shape;
  if ((char)pcVar22[2].m_userIndex != '\0') {
    return;
  }
  pcVar23 = body0->m_collisionObject;
  pcVar24 = pcVar33->m_collisionObject;
  fVar61 = (pcVar23->m_worldTransform).m_basis.m_el[1].m_floats[2];
  fVar65 = (pcVar24->m_worldTransform).m_basis.m_el[1].m_floats[2];
  cVar1 = (pcVar23->m_worldTransform).m_basis.m_el[0].m_floats[2];
  cVar2 = (pcVar24->m_worldTransform).m_basis.m_el[0].m_floats[2];
  cVar3 = (pcVar23->m_worldTransform).m_basis.m_el[2].m_floats[2];
  cVar4 = (pcVar24->m_worldTransform).m_basis.m_el[2].m_floats[2];
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar61 * fVar65)),ZEXT416((uint)cVar1),
                            ZEXT416((uint)cVar2));
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar3),ZEXT416((uint)cVar4));
  auVar35._8_4_ = 0x7fffffff;
  auVar35._0_8_ = 0x7fffffff7fffffff;
  auVar35._12_4_ = 0x7fffffff;
  auVar34 = vandps_avx512vl(auVar34,auVar35);
  if (auVar34._0_4_ < 0.99) {
    return;
  }
  fVar42 = (pcVar23->m_worldTransform).m_origin.m_floats[1];
  fVar41 = (pcVar24->m_worldTransform).m_origin.m_floats[1];
  fVar5 = (pcVar23->m_worldTransform).m_origin.m_floats[0];
  fVar6 = (pcVar24->m_worldTransform).m_origin.m_floats[0];
  cVar7 = (pcVar23->m_worldTransform).m_origin.m_floats[2];
  cVar8 = (pcVar24->m_worldTransform).m_origin.m_floats[2];
  pcVar25 = pcVar33->m_shape;
  auVar35 = vsubss_avx512f(ZEXT416((uint)cVar7),ZEXT416((uint)cVar8));
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)((fVar42 - fVar41) * fVar65)),ZEXT416((uint)cVar2),
                            ZEXT416((uint)(fVar5 - fVar6)));
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)cVar4),auVar35);
  auVar39._8_4_ = 0x7fffffff;
  auVar39._0_8_ = 0x7fffffff7fffffff;
  auVar39._12_4_ = 0x7fffffff;
  auVar34 = vandps_avx512vl(auVar34,auVar39);
  if (*(float *)&pcVar22[2].field_0x1c + *(float *)((long)&pcVar25[3]._vptr_cbtCollisionShape + 4) <
      auVar34._0_4_) {
    return;
  }
  uVar9 = *(uint *)((long)&pcVar22[2]._vptr_cbtCollisionShape + 4);
  fVar10 = (pcVar23->m_worldTransform).m_basis.m_el[0].m_floats[0];
  cVar11 = (pcVar23->m_worldTransform).m_basis.m_el[1].m_floats[1];
  fVar12 = (pcVar23->m_worldTransform).m_basis.m_el[1].m_floats[0];
  cVar13 = (pcVar23->m_worldTransform).m_basis.m_el[2].m_floats[1];
  auVar37 = ZEXT816(0) << 0x40;
  fVar14 = (pcVar23->m_worldTransform).m_basis.m_el[2].m_floats[0];
  uVar15 = pcVar22[2].m_shapeType;
  fVar16 = (pcVar23->m_worldTransform).m_basis.m_el[0].m_floats[1];
  auVar34 = vmulss_avx512f(ZEXT416((uint)cVar11),auVar37);
  uVar18 = *(ulong *)(pcVar24->m_worldTransform).m_basis.m_el[0].m_floats;
  auVar36 = vmulss_avx512f(ZEXT416((uint)cVar13),auVar37);
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 + fVar16 * 0.0)),ZEXT416((uint)cVar1),auVar37);
  uVar19 = *(ulong *)(pcVar24->m_worldTransform).m_basis.m_el[2].m_floats;
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 + auVar34._0_4_)),ZEXT416((uint)fVar61),auVar37);
  local_88._8_8_ = 0;
  local_88._0_8_ = uVar18;
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 + auVar36._0_4_)),ZEXT416((uint)cVar3),auVar37);
  uVar20 = *(ulong *)(pcVar24->m_worldTransform).m_basis.m_el[1].m_floats;
  register0x00001308 = 0;
  local_98 = uVar20;
  local_78._8_8_ = 0;
  local_78._0_8_ = uVar19;
  auVar34 = vmovshdup_avx(_local_98);
  auVar37 = vmovshdup_avx512vl(local_88);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar18;
  auVar38 = vfmadd231ss_avx512f(ZEXT416((uint)((float)uVar20 * auVar39._0_4_)),auVar38,auVar35);
  auVar34 = vfmadd213ss_fma(auVar37,auVar35,ZEXT416((uint)(auVar34._0_4_ * auVar39._0_4_)));
  auVar35 = vmovshdup_avx512vl(local_78);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar19;
  auVar39 = vfmadd231ss_avx512f(auVar38,auVar37,auVar36);
  auVar34 = vfmadd213ss_fma(auVar35,auVar36,auVar34);
  fVar40 = atan2f(auVar34._0_4_,auVar39._0_4_);
  uVar18 = *(ulong *)((long)&pcVar25[2]._vptr_cbtCollisionShape + 4);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar18;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)((long)&pcVar25[2].m_userPointer + 4);
  fVar17 = *(float *)&pcVar25[2].field_0xc;
  auVar35 = vsubps_avx(auVar34,auVar36);
  fVar26 = *(float *)&pcVar25[2].field_0x1c - fVar17;
  auVar34 = vmovshdup_avx(auVar35);
  fVar56 = auVar34._0_4_;
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar56 * fVar56)),auVar35,auVar35);
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
  auVar34 = vsqrtss_avx(auVar34,auVar34);
  fVar59 = auVar34._0_4_;
  if (fVar59 < 1e-30) {
    return;
  }
  auVar38 = ZEXT816(0) << 0x40;
  auVar34 = vmulss_avx512f(ZEXT416(uVar15),ZEXT416((uint)fVar16));
  auVar34 = vfmadd213ss_avx512f(ZEXT416((uint)fVar10),ZEXT416(uVar9),auVar34);
  auVar39 = vmulss_avx512f(ZEXT416(uVar15),ZEXT416((uint)cVar11));
  auVar34 = vfmadd213ss_avx512f(ZEXT416((uint)cVar1),auVar38,auVar34);
  auVar39 = vfmadd213ss_avx512f(ZEXT416((uint)fVar12),ZEXT416(uVar9),auVar39);
  auVar37 = vmulss_avx512f(ZEXT416(uVar15),ZEXT416((uint)cVar13));
  auVar39 = vfmadd213ss_avx512f(ZEXT416((uint)fVar61),auVar38,auVar39);
  auVar37 = vfmadd213ss_avx512f(ZEXT416((uint)fVar14),ZEXT416(uVar9),auVar37);
  auVar34 = vaddss_avx512f(ZEXT416((uint)fVar5),auVar34);
  auVar39 = vaddss_avx512f(auVar39,ZEXT416((uint)fVar42));
  auVar39 = vsubss_avx512f(auVar39,ZEXT416((uint)fVar41));
  fVar6 = auVar34._0_4_ - fVar6;
  auVar34 = vfmadd213ss_avx512f(ZEXT416((uint)cVar3),auVar38,auVar37);
  fVar61 = auVar39._0_4_;
  auVar62._0_4_ = fVar61 * (float)local_98._0_4_;
  auVar62._4_4_ = fVar61 * (float)local_98._4_4_;
  auVar62._8_4_ = fVar61 * fStack_90;
  auVar62._12_4_ = fVar61 * fStack_8c;
  auVar37 = vaddss_avx512f(auVar34,ZEXT416((uint)cVar7));
  auVar39 = vfmadd213ss_fma(ZEXT416((uint)cVar2),ZEXT416((uint)fVar6),
                            ZEXT416((uint)(fVar65 * fVar61)));
  auVar66._4_4_ = fVar6;
  auVar66._0_4_ = fVar6;
  auVar66._8_4_ = fVar6;
  auVar66._12_4_ = fVar6;
  auVar34 = vfmadd132ps_fma(auVar66,auVar62,local_88);
  auVar38 = vsubss_avx512f(auVar37,ZEXT416((uint)cVar8));
  uVar63 = auVar38._0_4_;
  auVar58._4_4_ = uVar63;
  auVar58._0_4_ = uVar63;
  auVar58._8_4_ = uVar63;
  auVar58._12_4_ = uVar63;
  auVar37 = vfmadd132ps_fma(auVar58,auVar34,local_78);
  auVar34 = vfmadd213ss_fma(ZEXT416((uint)cVar4),auVar38,auVar39);
  fVar65 = 1.0 / fVar59;
  fVar61 = auVar34._0_4_;
  auVar39 = vsubps_avx(auVar37,auVar36);
  auVar64._0_4_ = fVar65 * auVar35._0_4_;
  auVar64._4_4_ = fVar65 * auVar35._4_4_;
  auVar64._8_4_ = fVar65 * auVar35._8_4_;
  auVar64._12_4_ = fVar65 * auVar35._12_4_;
  auVar67._0_4_ = auVar39._0_4_ * auVar64._0_4_;
  auVar67._4_4_ = auVar39._4_4_ * auVar64._4_4_;
  auVar67._8_4_ = auVar39._8_4_ * auVar64._8_4_;
  auVar67._12_4_ = auVar39._12_4_ * auVar64._12_4_;
  auVar34 = vmovshdup_avx(auVar67);
  auVar34 = vfmadd231ss_fma(auVar34,auVar64,auVar39);
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)(fVar65 * fVar26)),
                            ZEXT416((uint)(fVar61 - fVar17)));
  fVar42 = auVar34._0_4_;
  if (fVar42 < 0.0) {
    return;
  }
  if (fVar59 < fVar42) {
    return;
  }
  auVar36 = vcvtss2sd_avx512f(in_XMM25,ZEXT416(*(uint *)&pcVar22[2].m_userPointer));
  auVar38 = vcvtss2sd_avx512f(in_XMM25,ZEXT416(*(uint *)((long)&pcVar22[2].m_userPointer + 4)));
  auVar46._0_4_ = (float)uVar18 + auVar64._0_4_ * fVar42;
  auVar46._4_4_ = (float)(uVar18 >> 0x20) + auVar64._4_4_ * fVar42;
  auVar46._8_4_ = auVar64._8_4_ * fVar42 + 0.0;
  auVar46._12_4_ = auVar64._12_4_ * fVar42 + 0.0;
  auVar39 = vsubps_avx(auVar37,auVar46);
  local_a8.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar46,ZEXT416((uint)(fVar17 + fVar42 * fVar65 * fVar26)),0x28);
  fVar65 = *(float *)&pcVar22[2].field_0xc;
  auVar34 = vmovshdup_avx(auVar39);
  auVar35 = vfmsub231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar56)),auVar34,auVar35);
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar34._0_4_)),auVar39,auVar39);
  auVar34 = vsqrtss_avx(auVar34,auVar34);
  fVar41 = 1.0 / auVar34._0_4_;
  fVar42 = fVar41 * 0.0;
  auVar57._0_4_ = auVar39._0_4_ * fVar41;
  auVar57._4_4_ = auVar39._4_4_ * fVar41;
  auVar57._8_4_ = auVar39._8_4_ * fVar41;
  auVar57._12_4_ = auVar39._12_4_ * fVar41;
  auVar60._0_4_ = fVar65 * auVar57._0_4_;
  auVar60._4_4_ = fVar65 * auVar57._4_4_;
  auVar60._8_4_ = fVar65 * auVar57._8_4_;
  auVar60._12_4_ = fVar65 * auVar57._12_4_;
  if (auVar35._0_4_ <= 0.0) {
    local_b8._4_4_ = auVar37._4_4_ + auVar60._4_4_;
    local_b8._0_4_ = auVar37._0_4_ + auVar60._0_4_;
    fStack_b0 = auVar37._8_4_ + auVar60._8_4_;
    fStack_ac = auVar37._12_4_ + auVar60._12_4_;
    fVar61 = fVar61 + fVar65 * fVar42;
    fVar42 = -fVar42;
    uVar18 = CONCAT44(auVar57._4_4_,auVar57._0_4_);
    auVar57._0_8_ = uVar18 ^ 0x8000000080000000;
    auVar57._8_4_ = -auVar57._8_4_;
    auVar57._12_4_ = -auVar57._12_4_;
  }
  else {
    _local_b8 = vsubps_avx(auVar37,auVar60);
    fVar61 = fVar61 - fVar65 * fVar42;
  }
  local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar57,ZEXT416((uint)fVar42));
  auVar34 = vmovshdup_avx(auVar57);
  fVar65 = atan2f(-auVar34._0_4_,-auVar57._0_4_);
  auVar47._0_8_ = fmod((double)fVar40 + auVar36._0_8_ + 1e-30,6.283185307179586);
  auVar47._8_56_ = extraout_var;
  uVar27 = vcmpsd_avx512f(auVar47._0_16_,ZEXT816(0) << 0x40,1);
  bVar21 = (bool)((byte)uVar27 & 1);
  auVar48._0_8_ = fmod((double)fVar40 + auVar38._0_8_ + 1e-30,6.283185307179586);
  auVar48._8_56_ = extraout_var_00;
  uVar27 = vcmpsd_avx512f(auVar48._0_16_,ZEXT816(0),1);
  bVar28 = (bool)((byte)uVar27 & 1);
  auVar49._0_8_ = fmod((double)fVar65,6.283185307179586);
  auVar49._8_56_ = extraout_var_01;
  uVar27 = vcmpsd_avx512f(auVar49._0_16_,ZEXT816(0),1);
  bVar29 = (bool)((byte)uVar27 & 1);
  dVar43 = fmod((double)((ulong)bVar21 * (long)(auVar47._0_8_ + 6.283185307179586) +
                        (ulong)!bVar21 * (long)auVar47._0_8_),6.283185307179586);
  dVar44 = fmod((double)((ulong)bVar28 * (long)(auVar48._0_8_ + 6.283185307179586) +
                        (ulong)!bVar28 * (long)auVar48._0_8_),6.283185307179586);
  dVar45 = fmod((double)((ulong)bVar29 * (long)(auVar49._0_8_ + 6.283185307179586) +
                        (ulong)!bVar29 * (long)auVar49._0_8_),6.283185307179586);
  auVar55 = ZEXT856(0);
  if (dVar44 <= dVar43) {
    if (dVar45 < dVar44) {
      return;
    }
  }
  else if (dVar44 <= dVar45) goto LAB_007eb999;
  if (dVar43 < dVar45) {
    return;
  }
LAB_007eb999:
  auVar52 = extraout_var_02;
  cVar68 = cbtTransform::operator*(&pcVar24->m_worldTransform,&local_a8);
  auVar53._0_8_ = cVar68.m_floats._8_8_;
  auVar53._8_56_ = auVar55;
  auVar50._0_8_ = cVar68.m_floats._0_8_;
  auVar50._8_56_ = auVar52;
  local_50 = vunpcklpd_avx(auVar50._0_16_,auVar53._0_16_);
  auVar52 = ZEXT856(local_50._8_8_);
  cVar68 = ::operator*(&(pcVar24->m_worldTransform).m_basis,&local_40);
  auVar54._0_8_ = cVar68.m_floats._8_8_;
  auVar54._8_56_ = auVar55;
  auVar51._0_8_ = cVar68.m_floats._0_8_;
  auVar51._8_56_ = auVar52;
  local_60 = vunpcklpd_avx(auVar51._0_16_,auVar54._0_16_);
  auVar34 = vmovshdup_avx(_local_b8);
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)((auVar34._0_4_ - local_a8.m_floats[1]) *
                                          local_40.m_floats[1])),
                            ZEXT416((uint)(local_b8._0_4_ - local_a8.m_floats[0])),
                            ZEXT416((uint)local_40.m_floats[0]));
  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)(fVar61 - local_a8.m_floats[2])),
                            ZEXT416((uint)local_40.m_floats[2]));
  auVar30._8_4_ = 0x7fffffff;
  auVar30._0_8_ = 0x7fffffff7fffffff;
  auVar30._12_4_ = 0x7fffffff;
  auVar35 = vandps_avx512vl(auVar34,auVar30);
  fVar65 = auVar35._0_4_;
  (*pcVar22->_vptr_cbtCollisionShape[0xc])(pcVar22);
  fVar61 = fVar65;
  (*pcVar25->_vptr_cbtCollisionShape[0xc])(pcVar25);
  if (auVar35._0_4_ <= fVar61 + fVar65) {
    local_118 = auVar34._0_8_;
    (*(resultOut->super_Result)._vptr_Result[4])(local_118,resultOut,local_60,local_50);
    cbtManifoldResult::refreshContactPoints(resultOut);
  }
  return;
}

Assistant:

void cbtArcSegmentCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                       const cbtCollisionObjectWrapper* body1,
                                                       const cbtDispatcherInfo& dispatchInfo,
                                                       cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* arcObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* segmentObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    // only 1 contact per pair, avoid persistence
    resultOut->getPersistentManifold()->clearManifold();

    const cbt2DarcShape* arc = (cbt2DarcShape*)arcObjWrap->getCollisionShape();
    const cbt2DsegmentShape* segment = (cbt2DsegmentShape*)segmentObjWrap->getCollisionShape();

    // A concave arc (i.e.with outward volume, counterclockwise abscissa) will never collide with segments
    if (arc->get_counterclock())
        return;

    const cbtTransform& m44Tarc = arcObjWrap->getCollisionObject()->getWorldTransform();
    const cbtTransform& m44Tsegment = segmentObjWrap->getCollisionObject()->getWorldTransform();

    // Shapes on two planes that are not so parallel? no collisions!
    cbtVector3 Zarc = m44Tarc.getBasis().getColumn(2);
    cbtVector3 Zsegment = m44Tsegment.getBasis().getColumn(2);
    if (fabs(Zarc.dot(Zsegment)) < 0.99)  //***TODO*** threshold as setting
        return;

    // Shapes on two planes that are too far? no collisions!
    cbtVector3 diff = m44Tsegment.invXform(m44Tarc.getOrigin());
    if (fabs(diff.getZ()) > (arc->get_zthickness() + segment->get_zthickness()))
        return;

    // vectors of body 1 in body 2 csys:
    cbtVector3 local_arc_center = m44Tsegment.invXform(m44Tarc * cbtVector3(arc->get_X(), arc->get_Y(), 0));
    cbtVector3 local_arc_X = m44Tsegment.getBasis().transpose() * (m44Tarc.getBasis() * cbtVector3(1, 0, 0));
    double local_arc_rot = atan2(local_arc_X.getY(), local_arc_X.getX());
    double arc1_angle1 = local_arc_rot + arc->get_angle1();
    double arc1_angle2 = local_arc_rot + arc->get_angle2();

    cbtVector3 local_CS1 = local_arc_center - segment->get_P1();
    cbtVector3 local_seg_S2S1 = (segment->get_P2() - segment->get_P1());
    cbtScalar seg_length = local_seg_S2S1.length();
    if (seg_length < 1e-30)
        return;
    cbtVector3 local_seg_D = local_seg_S2S1 / seg_length;
    cbtScalar param = local_CS1.dot(local_seg_D);

    // contact out of segment extrema?
    if (param < 0)
        return;
    if (param > seg_length)
        return;

    cbtVector3 local_P2 = segment->get_P1() + local_seg_D * param;
    cbtVector3 local_CP2 = local_arc_center - local_P2;
    local_CP2.setZ(0);
    cbtVector3 local_R = local_CP2.normalized() * arc->get_radius();
    cbtVector3 local_P1;
    cbtVector3 local_N2;
    if (local_seg_S2S1.cross(local_CP2).getZ() > 0) {
        local_P1 = local_arc_center - local_R;
        local_N2 = local_CP2.normalized();
    } else {
        local_P1 = local_arc_center + local_R;
        local_N2 = -local_CP2.normalized();
    }

    double alpha = atan2(-local_N2.getY(), -local_N2.getX());

    // Discard points out of min-max angles

    // to always positive angles:
    arc1_angle1 = fmod(arc1_angle1 + 1e-30, CH_C_2PI);
    if (arc1_angle1 < 0)
        arc1_angle1 += CH_C_2PI;
    arc1_angle2 = fmod(arc1_angle2 + 1e-30, CH_C_2PI);
    if (arc1_angle2 < 0)
        arc1_angle2 += CH_C_2PI;
    alpha = fmod(alpha, CH_C_2PI);
    if (alpha < 0)
        alpha += CH_C_2PI;

    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);

    alpha = fmod(alpha, CH_C_2PI);

    bool inangle1 = false;

    if (arc1_angle1 < arc1_angle2) {
        if (alpha >= arc1_angle2 || alpha <= arc1_angle1)
            inangle1 = true;
    } else {
        if (alpha >= arc1_angle2 && alpha <= arc1_angle1)
            inangle1 = true;
    }

    if (!inangle1)
        return;

    // transform in absolute coords:
    // cbtVector3 pos1 = m44Tsegment * local_P1; // not needed
    cbtVector3 pos2 = m44Tsegment * local_P2;
    cbtVector3 normal_on_2 = m44Tsegment.getBasis() * local_N2;
    cbtScalar dist = local_N2.dot(local_P1 - local_P2);

    // too far or too interpenetrate? discard.
    if (fabs(dist) > (arc->getMargin() + segment->getMargin()))
        return;

    /// report a contact. internally this will be kept persistent, and contact reduction is done
    resultOut->addContactPoint(normal_on_2, pos2, dist);

    resultOut->refreshContactPoints();
}